

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MSLSamplerBorderColor *pMVar2;
  size_t sVar3;
  Variant *pVVar4;
  pointer puVar5;
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> _Var6;
  undefined8 uVar7;
  string *psVar8;
  undefined4 uVar9;
  bool *pbVar10;
  char cVar11;
  bool bVar12;
  char cVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  CompilerMSL *pCVar18;
  SPIRType *pSVar19;
  mapped_type *pmVar20;
  long *plVar21;
  SPIRType *pSVar22;
  undefined8 *puVar23;
  runtime_error *prVar24;
  uint uVar25;
  long lVar26;
  size_type *psVar27;
  ulong *puVar28;
  Parameter *pPVar29;
  ulong uVar30;
  uint uVar31;
  CompilerMSL *pCVar32;
  bool *pbVar33;
  Resource *pRVar34;
  undefined8 uVar35;
  ulong uVar36;
  _Alloc_hider _Var37;
  uint *in_R9;
  uint32_t plane;
  long lVar38;
  SPIRVariable *pSVar39;
  pointer *ppuVar40;
  string *psVar41;
  uint uVar42;
  SPIRVariable *unaff_R15;
  SPIRVariable *pSVar43;
  byte bVar44;
  string __str_1;
  uint32_t var_id;
  string primary_name;
  __hashtable *__h;
  string __str;
  SmallVector<Resource,_8UL> resources;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  ID local_3c4;
  string *local_3c0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  BaseType local_388;
  uint32_t local_384;
  undefined8 local_380;
  CompilerMSL *local_378;
  SPIRVariable *local_370;
  SPIRType *local_368;
  string local_360;
  string local_340;
  string local_320;
  Parameter *local_300;
  long local_2f8;
  undefined1 local_2f0 [24];
  SPIRVariable *local_2d8;
  SmallVector<unsigned_int,_8UL> *local_2d0;
  CompilerMSL *local_2c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2c0;
  Resource *local_2b8;
  ulong *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  ulong local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  SmallVector<unsigned_int,_8UL> *local_270;
  string local_268;
  undefined1 local_248 [536];
  
  bVar44 = 0;
  local_248._0_8_ = local_248 + 0x18;
  local_248._8_8_ = 0;
  local_248._16_8_ = 8;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_3c0 = ep_args;
  local_378 = this;
  if (sVar3 != 0) {
    pRVar34 = (Resource *)
              (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_2b8 = (Resource *)((long)&pRVar34->var + sVar3 * 4);
    local_2d8 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2d0 = (SmallVector<unsigned_int,_8UL> *)&this->constexpr_samplers_by_id;
    local_2c0 = &(this->atomic_image_vars)._M_h;
    do {
      uVar42 = *(uint *)&pRVar34->var;
      this = (CompilerMSL *)(ulong)uVar42;
      pVVar4 = (local_378->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[(long)this].type == TypeVariable) {
        local_370 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + (long)this);
        local_3e8._M_dataplus._M_p._0_4_ = uVar42;
        if (((local_370->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
            ((0x1205U >> (local_370->storage & 0x1f) & 1) != 0)) &&
           (bVar12 = Compiler::is_hidden_variable((Compiler *)local_378,local_370,false), !bVar12))
        {
          local_368 = Compiler::get_variable_data_type((Compiler *)local_378,local_370);
          pCVar32 = local_378;
          bVar12 = is_supported_argument_buffer_type(local_378,local_368);
          if ((bVar12) && (local_370->storage != StorageClassPushConstant)) {
            uVar14 = Compiler::get_decoration
                               ((Compiler *)pCVar32,local_3e8._M_dataplus._M_p._0_4_,
                                DecorationDescriptorSet);
            pCVar32 = local_378;
            if ((uVar14 < 8) &&
               (((local_378->msl_options).argument_buffers != false &&
                (this = local_378,
                (local_378->argument_buffer_discrete_mask >> (uVar14 & 0x1f) & 1) == 0))))
            goto LAB_002e1e4d;
          }
          uVar35 = local_248._0_8_;
          local_2f0._16_8_ = pRVar34;
          if (((local_370->storage == StorageClassStorageBuffer) ||
              (local_370->storage == StorageClassUniform)) && (local_248._8_8_ != 0)) {
            lVar38 = local_248._8_8_ * 0x40;
            pSVar39 = (SPIRVariable *)0x0;
            lVar26 = 0;
            do {
              uVar14 = Compiler::get_decoration
                                 ((Compiler *)pCVar32,
                                  (ID)*(uint32_t *)
                                       (*(long *)((long)(SPIRVariable **)uVar35 + lVar26) + 8),
                                  DecorationDescriptorSet);
              uVar15 = Compiler::get_decoration
                                 ((Compiler *)pCVar32,local_3e8._M_dataplus._M_p._0_4_,
                                  DecorationDescriptorSet);
              pCVar32 = local_378;
              if (uVar14 == uVar15) {
                uVar14 = Compiler::get_decoration
                                   ((Compiler *)local_378,
                                    (ID)*(uint32_t *)
                                         (*(long *)((long)(SPIRVariable **)uVar35 + lVar26) + 8),
                                    DecorationBinding);
                uVar15 = Compiler::get_decoration
                                   ((Compiler *)pCVar32,local_3e8._M_dataplus._M_p._0_4_,
                                    DecorationBinding);
                if (uVar14 != uVar15) goto LAB_002e1b3c;
                unaff_R15 = (SPIRVariable *)0x0;
                if ((*(int *)((long)(uVar35 + 0x30) + lVar26) == 0xf) &&
                   (*(int *)&(local_368->super_IVariant).field_0xc == 0xf)) {
                  pSVar43 = *(SPIRVariable **)((long)(SPIRVariable **)uVar35 + lVar26);
                  if ((pSVar43->storage != StorageClassStorageBuffer) &&
                     (pSVar43->storage != StorageClassUniform)) goto LAB_002e1b3c;
                  if ((local_368->array).super_VectorView<unsigned_int>.buffer_size != 0) {
                    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_3b8._0_8_ = local_3a8;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3b8,
                               "Aliasing arrayed discrete descriptors is currently not supported.",
                               "");
                    ::std::runtime_error::runtime_error(prVar24,(string *)local_3b8);
                    *(undefined ***)prVar24 = &PTR__runtime_error_003fce08;
                    __cxa_throw(prVar24,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  *(SPIRVariable **)((long)(uVar35 + 8) + lVar26) = pSVar43;
                  sVar16 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)local_2d8,(key_type *)&local_3e8);
                  unaff_R15 = (SPIRVariable *)0x1;
                  pSVar39 = pSVar43;
                  if (sVar16 != 0) {
                    local_360._M_dataplus._M_p._0_4_ =
                         *(undefined4 *)(*(long *)((long)(SPIRVariable **)uVar35 + lVar26) + 8);
                    local_3b8._0_8_ = local_2d8;
                    ::std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_2d8,&local_360,local_3b8);
                  }
                }
              }
              else {
LAB_002e1b3c:
                unaff_R15 = (SPIRVariable *)0x0;
              }
              pCVar32 = local_378;
            } while (((char)unaff_R15 == '\0') &&
                    (bVar12 = lVar38 + -0x40 != lVar26, lVar26 = lVar26 + 0x40, bVar12));
          }
          else {
            pSVar39 = (SPIRVariable *)0x0;
          }
          if (*(int *)&(local_368->super_IVariant).field_0xc - 0x11U < 2) {
            this = (CompilerMSL *)find_constexpr_sampler(pCVar32,local_3e8._M_dataplus._M_p._0_4_);
            pRVar34 = (Resource *)local_2f0._16_8_;
            if (this == (CompilerMSL *)0x0) {
              this = (CompilerMSL *)0x0;
            }
            else {
              pmVar17 = ::std::
                        map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                        ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                      *)local_2d0,(key_type *)&local_3e8);
              pCVar32 = this;
              for (lVar26 = 0x19; lVar26 != 0; lVar26 = lVar26 + -1) {
                pmVar17->coord =
                     *(MSLSamplerCoord *)
                      &(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler;
                pCVar32 = (CompilerMSL *)((long)pCVar32 + (ulong)bVar44 * -8 + 4);
                pmVar17 = (mapped_type *)((long)pmVar17 + (ulong)bVar44 * -8 + 4);
              }
            }
          }
          else {
            this = (CompilerMSL *)0x0;
            pRVar34 = (Resource *)local_2f0._16_8_;
          }
          local_3b8._0_4_ = (local_370->super_IVariant).self.id;
          sVar16 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(local_2c0,(key_type *)local_3b8);
          if (sVar16 == 0) {
            uVar14 = 0;
          }
          else {
            uVar14 = get_metal_resource_index(local_378,local_370,AtomicCounter,0);
          }
          if (*(int *)&(local_368->super_IVariant).field_0xc == 0x11) {
            CompilerGLSL::add_resource_name
                      (&local_378->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
            pCVar32 = local_378;
            uVar15 = 1;
            if ((this != (CompilerMSL *)0x0) &&
               (*(bool *)((long)(this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.
                                aligned_char + 0x23) == true)) {
              uVar15 = (uint32_t)
                       (this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.buffer_size;
            }
            local_2c8 = this;
            if (uVar15 != 0) {
              plane = 0;
              do {
                unaff_R15 = local_370;
                local_3b8._0_8_ = local_370;
                local_3b8._8_8_ = pSVar39;
                (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_3a8,pCVar32,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
                local_388 = Image;
                local_384 = get_metal_resource_index(pCVar32,unaff_R15,Image,plane);
                local_380 = CONCAT44(uVar14,plane);
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b8);
                if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                  operator_delete((void *)local_3a8._0_8_);
                }
                plane = plane + 1;
              } while (uVar15 != plane);
            }
            pRVar34 = (Resource *)local_2f0._16_8_;
            this = pCVar32;
            if ((local_2c8 == (CompilerMSL *)0x0) && ((local_368->image).dim != DimBuffer)) {
              local_3b8._0_8_ = local_370;
              local_3b8._8_8_ = pSVar39;
              to_sampler_expression_abi_cxx11_
                        ((string *)local_3a8,pCVar32,local_3e8._M_dataplus._M_p._0_4_);
              local_388 = Sampler;
              local_384 = get_metal_resource_index(local_378,local_370,Sampler,0);
              local_380 = 0;
LAB_002e1e27:
              SmallVector<Resource,_8UL>::push_back
                        ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b8);
              if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                operator_delete((void *)local_3a8._0_8_);
              }
            }
          }
          else if (this == (CompilerMSL *)0x0) {
            CompilerGLSL::add_resource_name
                      (&local_378->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
            unaff_R15 = (SPIRVariable *)0xffffffff;
            if (pSVar39 == (SPIRVariable *)0x0) {
              uVar15 = get_metal_resource_index
                                 (local_378,local_370,
                                  *(BaseType *)&(local_368->super_IVariant).field_0xc,0);
              unaff_R15 = (SPIRVariable *)(ulong)uVar15;
            }
            local_3b8._0_8_ = local_370;
            local_3b8._8_8_ = pSVar39;
            (*(local_378->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_3a8,local_378,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
            local_388 = *(BaseType *)&(local_368->super_IVariant).field_0xc;
            local_384 = (uint32_t)unaff_R15;
            local_380 = (ulong)uVar14 << 0x20;
            goto LAB_002e1e27;
          }
        }
      }
LAB_002e1e4d:
      pRVar34 = (Resource *)((long)&pRVar34->var + 4);
    } while (pRVar34 != local_2b8);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_408);
  uVar35 = local_248._0_8_;
  if (local_248._8_8_ != 0) {
    pRVar34 = (Resource *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    pSVar39 = (SPIRVariable *)((local_248._8_8_ - ((long)(local_248._8_8_ + 1) >> 0x3f)) + 1 >> 1);
    if (0x1fffffffffffffe < (long)pSVar39) {
      pSVar39 = (SPIRVariable *)0x1ffffffffffffff;
    }
    do {
      if ((long)pSVar39 < 1) {
        pCVar32 = (CompilerMSL *)0x0;
        pSVar43 = (SPIRVariable *)0x0;
        break;
      }
      pCVar18 = (CompilerMSL *)operator_new((long)pSVar39 << 6,(nothrow_t *)&::std::nothrow);
      pCVar32 = pCVar18;
      pSVar43 = pSVar39;
      if (pCVar18 == (CompilerMSL *)0x0) {
        pCVar32 = this;
        pSVar43 = unaff_R15;
        if (pSVar39 == (SPIRVariable *)0x1) {
          pSVar39 = (SPIRVariable *)0x0;
        }
        else {
          pSVar39 = (SPIRVariable *)
                    ((ulong)((long)&(pSVar39->super_IVariant)._vptr_IVariant + 1U) >> 1);
        }
      }
      this = pCVar32;
      unaff_R15 = pSVar43;
    } while (pCVar18 == (CompilerMSL *)0x0);
    if (pCVar32 == (CompilerMSL *)0x0) {
      pCVar32 = (CompilerMSL *)0x0;
      pSVar43 = (SPIRVariable *)0x0;
    }
    else if (pSVar43 != (SPIRVariable *)0x0) {
      _Var6._M_head_impl = *(ObjectPoolGroup **)(uVar35 + 8);
      (pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler =
           (_func_int **)*(SPIRVariable **)uVar35;
      (pCVar32->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
      super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
      .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
           _Var6._M_head_impl;
      ppuVar40 = &(pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      (pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar40;
      puVar5 = (pointer)(((string *)(uVar35 + 0x10))->_M_dataplus)._M_p;
      paVar1 = &((string *)(uVar35 + 0x10))->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5 == paVar1) {
        pVVar4 = *(Variant **)((long)&((string *)(uVar35 + 0x10))->field_2 + 8);
        *ppuVar40 = (pointer)paVar1->_M_allocated_capacity;
        (pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
        ptr = pVVar4;
      }
      else {
        (pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        (pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)paVar1->_M_allocated_capacity;
      }
      (pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((string *)(uVar35 + 0x10))->_M_string_length;
      (((string *)(uVar35 + 0x10))->_M_dataplus)._M_p = (pointer)paVar1;
      ((string *)(uVar35 + 0x10))->_M_string_length = 0;
      (((string *)(uVar35 + 0x10))->field_2)._M_local_buf[0] = '\0';
      uVar7 = *(undefined8 *)(uVar35 + 0x38);
      (pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
      buffer_size = *(size_t *)(uVar35 + 0x30);
      (pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.buffer_capacity = uVar7;
      pCVar18 = pCVar32;
      if (pSVar43 != (SPIRVariable *)0x1) {
        lVar26 = (long)pSVar43 * 0x40 + -0x40;
        pbVar10 = (bool *)((long)(pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.
                                 aligned_char + 0x20);
        do {
          pbVar33 = pbVar10;
          *(undefined8 *)(pbVar33 + -0x20) = *(undefined8 *)(pbVar33 + -0x60);
          *(undefined8 *)(pbVar33 + -0x18) = *(undefined8 *)(pbVar33 + -0x58);
          *(bool **)(pbVar33 + -0x10) = pbVar33;
          pMVar2 = (MSLSamplerBorderColor *)(pbVar33 + -0x40);
          if (pMVar2 == (MSLSamplerBorderColor *)*(undefined8 **)(pbVar33 + -0x50)) {
            *(undefined8 *)pbVar33 = *(undefined8 *)pMVar2;
            *(undefined8 *)(pbVar33 + 8) = *(undefined8 *)(pbVar33 + -0x38);
          }
          else {
            *(undefined8 **)(pbVar33 + -0x10) = *(undefined8 **)(pbVar33 + -0x50);
            *(undefined8 *)pbVar33 = *(undefined8 *)(pbVar33 + -0x40);
          }
          *(undefined8 *)(pbVar33 + -8) = *(undefined8 *)(pbVar33 + -0x48);
          *(MSLSamplerBorderColor **)(pbVar33 + -0x50) = pMVar2;
          *(undefined8 *)(pbVar33 + -0x48) = 0;
          pbVar33[-0x40] = false;
          *(undefined8 *)(pbVar33 + 0x10) = *(undefined8 *)(pbVar33 + -0x30);
          *(undefined8 *)(pbVar33 + 0x18) = *(undefined8 *)(pbVar33 + -0x28);
          lVar26 = lVar26 + -0x40;
          pbVar10 = pbVar33 + 0x40;
        } while (lVar26 != 0);
        pCVar18 = (CompilerMSL *)(pbVar33 + -0x20);
      }
      _Var6._M_head_impl =
           (pCVar18->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
      *(SPIRVariable **)uVar35 =
           (SPIRVariable *)(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler;
      *(ObjectPoolGroup **)(uVar35 + 8) = _Var6._M_head_impl;
      ::std::__cxx11::string::operator=
                ((string *)(uVar35 + 0x10),
                 (string *)&(pCVar18->super_CompilerGLSL).super_Compiler.ir.spirv);
      uVar7 = (pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.buffer_capacity;
      *(size_t *)(uVar35 + 0x30) =
           (pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
           super_VectorView<spirv_cross::Variant>.buffer_size;
      *(undefined8 *)(uVar35 + 0x38) = uVar7;
    }
    if (pCVar32 == (CompilerMSL *)0x0) {
      ::std::
      __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar35,pRVar34);
    }
    else {
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar35,pRVar34,pCVar32,pSVar43);
    }
    if (pSVar43 != (SPIRVariable *)0x0) {
      lVar26 = (long)pSVar43 << 6;
      ppuVar40 = &(pCVar32->super_CompilerGLSL).super_Compiler.ir.spirv.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      do {
        if (ppuVar40 != (pointer *)((_Vector_impl_data *)(ppuVar40 + -2))->_M_start) {
          operator_delete(((_Vector_impl_data *)(ppuVar40 + -2))->_M_start);
        }
        ppuVar40 = ppuVar40 + 8;
        lVar26 = lVar26 + -0x40;
      } while (lVar26 != 0);
    }
    operator_delete(pCVar32);
  }
  if (local_248._8_8_ != 0) {
    local_2b8 = (Resource *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    local_2c8 = (CompilerMSL *)&local_378->plane_name_suffix;
    local_368 = (SPIRType *)&(local_378->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2c0 = &(local_378->atomic_image_vars)._M_h;
    local_2d8 = (SPIRVariable *)&(local_378->super_CompilerGLSL).super_Compiler.ir.meta;
    local_2d0 = &local_378->buffer_aliases_discrete;
    local_270 = &local_378->buffer_arrays_discrete;
    pCVar32 = local_378;
    pRVar34 = (Resource *)local_248._0_8_;
    do {
      pSVar39 = pRVar34->var;
      pSVar19 = Compiler::get_variable_data_type((Compiler *)pCVar32,pSVar39);
      local_3c4.id = (pSVar39->super_IVariant).self.id;
      local_370 = pSVar39;
      switch(pRVar34->basetype) {
      case Struct:
        pmVar20 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_2d8,&(pSVar19->super_IVariant).self);
        if ((pmVar20->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
          if (pRVar34->descriptor_alias == (SPIRVariable *)0x0) {
            sVar3 = (pSVar19->array).super_VectorView<unsigned_int>.buffer_size;
            if (sVar3 == 0) {
              if (local_3c0->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)local_3c0);
              }
              pSVar39 = local_370;
              pSVar22 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   *(uint *)&(local_370->super_IVariant).field_0xc);
              get_type_address_space_abi_cxx11_
                        (&local_340,pCVar32,pSVar22,(pSVar39->super_IVariant).self.id,true);
              puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_340);
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              puVar28 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar28) {
                local_320.field_2._M_allocated_capacity = *puVar28;
                local_320.field_2._8_8_ = puVar23[3];
              }
              else {
                local_320.field_2._M_allocated_capacity = *puVar28;
                local_320._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_320._M_string_length = puVar23[1];
              *puVar23 = puVar28;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_300,pCVar32,pSVar19,0);
              psVar41 = local_3c0;
              uVar35 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                uVar35 = local_320.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar35 < local_2f8 + local_320._M_string_length) {
                uVar30 = 0xf;
                if (local_300 != (Parameter *)local_2f0) {
                  uVar30 = local_2f0._0_8_;
                }
                if (uVar30 < local_2f8 + local_320._M_string_length) goto LAB_002e40c1;
                puVar23 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_300,0,(char *)0x0,
                                     (ulong)local_320._M_dataplus._M_p);
              }
              else {
LAB_002e40c1:
                puVar23 = (undefined8 *)
                          ::std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_300);
              }
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              puVar28 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar28) {
                local_360.field_2._M_allocated_capacity = *puVar28;
                local_360.field_2._8_8_ = puVar23[3];
              }
              else {
                local_360.field_2._M_allocated_capacity = *puVar28;
                local_360._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_360._M_string_length = puVar23[1];
              *puVar23 = puVar28;
              puVar23[1] = 0;
              *(undefined1 *)puVar28 = 0;
              puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_360);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              psVar27 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8.field_2._8_8_ = puVar23[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_3e8._M_string_length = puVar23[1];
              *puVar23 = psVar27;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              to_restrict(pCVar32,local_3c4.id,true);
              plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              psVar27 = (size_type *)(plVar21 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar21 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408.field_2._8_8_ = plVar21[3];
              }
              else {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408._M_dataplus._M_p = (pointer)*plVar21;
              }
              local_408._M_string_length = plVar21[1];
              *plVar21 = (long)psVar27;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              plVar21 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_408,
                                           (ulong)(pRVar34->name)._M_dataplus._M_p);
              local_3b8._0_8_ = local_3a8;
              pSVar39 = (SPIRVariable *)(plVar21 + 2);
              if ((SPIRVariable *)*plVar21 == pSVar39) {
                local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                local_3a8._8_8_ = plVar21[3];
              }
              else {
                local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                local_3b8._0_8_ = (SPIRVariable *)*plVar21;
              }
              local_3b8._8_8_ = plVar21[1];
              *plVar21 = (long)pSVar39;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p);
              }
              if (local_300 != (Parameter *)local_2f0) {
                operator_delete(local_300);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p);
              }
              uVar42 = pRVar34->index;
              cVar13 = '\x01';
              if (9 < uVar42) {
                uVar31 = uVar42;
                cVar11 = '\x04';
                do {
                  cVar13 = cVar11;
                  if (uVar31 < 100) {
                    cVar13 = cVar13 + -2;
                    goto LAB_002e469a;
                  }
                  if (uVar31 < 1000) {
                    cVar13 = cVar13 + -1;
                    goto LAB_002e469a;
                  }
                  if (uVar31 < 10000) goto LAB_002e469a;
                  bVar12 = 99999 < uVar31;
                  uVar31 = uVar31 / 10000;
                  cVar11 = cVar13 + '\x04';
                } while (bVar12);
                cVar13 = cVar13 + '\x01';
              }
LAB_002e469a:
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
              puVar23 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b28a);
              pCVar32 = local_378;
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              psVar27 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408.field_2._8_8_ = puVar23[3];
              }
              else {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_408._M_string_length = puVar23[1];
              *puVar23 = psVar27;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
              local_3b8._0_8_ = local_3a8;
              pSVar39 = (SPIRVariable *)(puVar23 + 2);
              if ((SPIRVariable *)*puVar23 == pSVar39) {
                local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                local_3a8._8_8_ = puVar23[3];
              }
              else {
                local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                local_3b8._0_8_ = (SPIRVariable *)*puVar23;
              }
              local_3b8._8_8_ = puVar23[1];
              *puVar23 = pSVar39;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              sVar16 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_368,&local_3c4.id);
              if (sVar16 != 0) {
                ::std::__cxx11::string::append((char *)local_3c0);
              }
              ::std::__cxx11::string::append((char *)local_3c0);
            }
            else {
              if (sVar3 != 1) {
                prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_3b8._0_8_ = local_3a8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3b8,"Arrays of arrays of buffers are not supported.","");
                ::std::runtime_error::runtime_error(prVar24,(string *)local_3b8);
                *(undefined ***)prVar24 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              uVar14 = CompilerGLSL::to_array_size_literal(&pCVar32->super_CompilerGLSL,pSVar19);
              if (uVar14 == 0) {
                prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_3b8._0_8_ = local_3a8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3b8,"Unsized arrays of buffers are not supported in MSL."
                           ,"");
                ::std::runtime_error::runtime_error(prVar24,(string *)local_3b8);
                *(undefined ***)prVar24 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              pCVar32->is_using_builtin_array = true;
              SmallVector<unsigned_int,_8UL>::reserve
                        (local_270,
                         (pCVar32->buffer_arrays_discrete).super_VectorView<unsigned_int>.
                         buffer_size + 1);
              sVar3 = (pCVar32->buffer_arrays_discrete).super_VectorView<unsigned_int>.buffer_size;
              (pCVar32->buffer_arrays_discrete).super_VectorView<unsigned_int>.ptr[sVar3] =
                   local_3c4.id;
              (pCVar32->buffer_arrays_discrete).super_VectorView<unsigned_int>.buffer_size =
                   sVar3 + 1;
              uVar30 = 0;
              local_2f0._16_4_ = uVar14;
              do {
                if (local_3c0->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3c0);
                }
                pSVar39 = local_370;
                pSVar22 = Variant::get<spirv_cross::SPIRType>
                                    ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     *(uint *)&(local_370->super_IVariant).field_0xc);
                get_type_address_space_abi_cxx11_
                          (&local_268,pCVar32,pSVar22,(pSVar39->super_IVariant).self.id,true);
                plVar21 = (long *)::std::__cxx11::string::append((char *)&local_268);
                local_300 = (Parameter *)local_2f0;
                pPVar29 = (Parameter *)(plVar21 + 2);
                if ((Parameter *)*plVar21 == pPVar29) {
                  local_2f0._0_4_ = pPVar29->type;
                  local_2f0._4_4_ = pPVar29->id;
                  local_2f0._8_4_ = *(undefined4 *)(plVar21 + 3);
                  local_2f0._12_4_ = *(uint32_t *)((long)plVar21 + 0x1c);
                }
                else {
                  local_2f0._0_4_ = pPVar29->type;
                  local_2f0._4_4_ = pPVar29->id;
                  local_300 = (Parameter *)*plVar21;
                }
                local_2f8 = plVar21[1];
                *plVar21 = (long)pPVar29;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_290,pCVar32,pSVar19,0);
                uVar36 = 0xf;
                if (local_300 != (Parameter *)local_2f0) {
                  uVar36 = local_2f0._0_8_;
                }
                if (uVar36 < (ulong)(local_288 + local_2f8)) {
                  uVar36 = 0xf;
                  if (local_290 != local_280) {
                    uVar36 = local_280[0];
                  }
                  if (uVar36 < (ulong)(local_288 + local_2f8)) goto LAB_002e2aff;
                  puVar23 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_290,0,(char *)0x0,(ulong)local_300);
                }
                else {
LAB_002e2aff:
                  puVar23 = (undefined8 *)
                            ::std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_290);
                }
                local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                puVar28 = puVar23 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar28) {
                  local_340.field_2._M_allocated_capacity = *puVar28;
                  local_340.field_2._8_8_ = puVar23[3];
                }
                else {
                  local_340.field_2._M_allocated_capacity = *puVar28;
                  local_340._M_dataplus._M_p = (pointer)*puVar23;
                }
                local_340._M_string_length = puVar23[1];
                *puVar23 = puVar28;
                puVar23[1] = 0;
                *(undefined1 *)puVar28 = 0;
                puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_340);
                local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                puVar28 = puVar23 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar28) {
                  local_320.field_2._M_allocated_capacity = *puVar28;
                  local_320.field_2._8_8_ = puVar23[3];
                }
                else {
                  local_320.field_2._M_allocated_capacity = *puVar28;
                  local_320._M_dataplus._M_p = (pointer)*puVar23;
                }
                local_320._M_string_length = puVar23[1];
                *puVar23 = puVar28;
                puVar23[1] = 0;
                *(undefined1 *)(puVar23 + 2) = 0;
                to_restrict(pCVar32,local_3c4.id,true);
                puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_320);
                local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                puVar28 = puVar23 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar28) {
                  local_360.field_2._M_allocated_capacity = *puVar28;
                  local_360.field_2._8_8_ = puVar23[3];
                }
                else {
                  local_360.field_2._M_allocated_capacity = *puVar28;
                  local_360._M_dataplus._M_p = (pointer)*puVar23;
                }
                local_360._M_string_length = puVar23[1];
                *puVar23 = puVar28;
                puVar23[1] = 0;
                *(undefined1 *)(puVar23 + 2) = 0;
                puVar23 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_360,(ulong)(pRVar34->name)._M_dataplus._M_p);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                psVar27 = puVar23 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_3e8.field_2._M_allocated_capacity = *psVar27;
                  local_3e8.field_2._8_8_ = puVar23[3];
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *psVar27;
                  local_3e8._M_dataplus._M_p = (pointer)*puVar23;
                }
                local_3e8._M_string_length = puVar23[1];
                *puVar23 = psVar27;
                puVar23[1] = 0;
                *(undefined1 *)(puVar23 + 2) = 0;
                plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                puVar28 = (ulong *)(plVar21 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar21 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar28) {
                  local_408.field_2._M_allocated_capacity = *puVar28;
                  local_408.field_2._8_8_ = plVar21[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *puVar28;
                  local_408._M_dataplus._M_p = (pointer)*plVar21;
                }
                local_408._M_string_length = plVar21[1];
                *plVar21 = (long)puVar28;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                cVar13 = '\x01';
                uVar42 = (uint)uVar30;
                if (9 < uVar42) {
                  cVar11 = '\x04';
                  do {
                    cVar13 = cVar11;
                    uVar31 = (uint)uVar30;
                    if (uVar31 < 100) {
                      cVar13 = cVar13 + -2;
                      goto LAB_002e2d60;
                    }
                    if (uVar31 < 1000) {
                      cVar13 = cVar13 + -1;
                      goto LAB_002e2d60;
                    }
                    if (uVar31 < 10000) goto LAB_002e2d60;
                    uVar30 = uVar30 / 10000;
                    cVar11 = cVar13 + '\x04';
                  } while (99999 < uVar31);
                  cVar13 = cVar13 + '\x01';
                }
LAB_002e2d60:
                local_2b0 = local_2a0;
                ::std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar13);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)local_2b0,local_2a8,uVar42);
                uVar35 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  uVar35 = local_408.field_2._M_allocated_capacity;
                }
                uVar30 = CONCAT44(uStack_2a4,local_2a8) + local_408._M_string_length;
                if ((ulong)uVar35 < uVar30) {
                  uVar36 = 0xf;
                  if (local_2b0 != local_2a0) {
                    uVar36 = local_2a0[0];
                  }
                  if (uVar36 < uVar30) goto LAB_002e2dea;
                  plVar21 = (long *)::std::__cxx11::string::replace
                                              ((ulong)&local_2b0,0,(char *)0x0,
                                               (ulong)local_408._M_dataplus._M_p);
                }
                else {
LAB_002e2dea:
                  plVar21 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_408,(ulong)local_2b0);
                }
                local_3b8._0_8_ = local_3a8;
                pSVar39 = (SPIRVariable *)(plVar21 + 2);
                if ((SPIRVariable *)*plVar21 == pSVar39) {
                  local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = plVar21[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*plVar21;
                }
                local_3b8._8_8_ = plVar21[1];
                *plVar21 = (long)pSVar39;
                plVar21[1] = 0;
                *(undefined1 *)&(pSVar39->super_IVariant)._vptr_IVariant = 0;
                ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
                if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                if (local_2b0 != local_2a0) {
                  operator_delete(local_2b0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p);
                }
                if (local_290 != local_280) {
                  operator_delete(local_290);
                }
                if (local_300 != (Parameter *)local_2f0) {
                  operator_delete(local_300);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p);
                }
                uVar31 = pRVar34->index + uVar42;
                cVar13 = '\x01';
                if (9 < uVar31) {
                  uVar25 = uVar31;
                  cVar11 = '\x04';
                  do {
                    cVar13 = cVar11;
                    if (uVar25 < 100) {
                      cVar13 = cVar13 + -2;
                      goto LAB_002e2fae;
                    }
                    if (uVar25 < 1000) {
                      cVar13 = cVar13 + -1;
                      goto LAB_002e2fae;
                    }
                    if (uVar25 < 10000) goto LAB_002e2fae;
                    bVar12 = 99999 < uVar25;
                    uVar25 = uVar25 / 10000;
                    cVar11 = cVar13 + '\x04';
                  } while (bVar12);
                  cVar13 = cVar13 + '\x01';
                }
LAB_002e2fae:
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar31);
                plVar21 = (long *)::std::__cxx11::string::replace
                                            ((ulong)&local_3e8,0,(char *)0x0,0x37b28a);
                pCVar32 = local_378;
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                psVar27 = (size_type *)(plVar21 + 2);
                uVar9 = local_2f0._16_4_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar21 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_408.field_2._M_allocated_capacity = *psVar27;
                  local_408.field_2._8_8_ = plVar21[3];
                }
                else {
                  local_408.field_2._M_allocated_capacity = *psVar27;
                  local_408._M_dataplus._M_p = (pointer)*plVar21;
                }
                local_408._M_string_length = plVar21[1];
                *plVar21 = (long)psVar27;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
                local_3b8._0_8_ = local_3a8;
                pSVar39 = (SPIRVariable *)(puVar23 + 2);
                if ((SPIRVariable *)*puVar23 == pSVar39) {
                  local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = puVar23[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*puVar23;
                }
                local_3b8._8_8_ = puVar23[1];
                *puVar23 = pSVar39;
                puVar23[1] = 0;
                *(undefined1 *)(puVar23 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
                if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                sVar16 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)local_368,&local_3c4.id);
                if (sVar16 != 0) {
                  ::std::__cxx11::string::append((char *)local_3c0);
                }
                ::std::__cxx11::string::append((char *)local_3c0);
                uVar30 = (ulong)(uVar42 + 1);
              } while (uVar42 + 1 != uVar9);
              pCVar32->is_using_builtin_array = false;
            }
          }
          else {
            if (pRVar34->var == pRVar34->descriptor_alias) {
              uVar14 = Compiler::get_decoration
                                 ((Compiler *)pCVar32,local_3c4,DecorationDescriptorSet);
              local_408._M_dataplus._M_p._0_4_ = uVar14;
              uVar14 = Compiler::get_decoration((Compiler *)pCVar32,local_3c4,DecorationBinding);
              psVar41 = local_3c0;
              local_3e8._M_dataplus._M_p._0_4_ = uVar14;
              join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                        ((string *)local_3b8,(spirv_cross *)"spvBufferAliasSet",
                         (char (*) [18])&local_408,(uint *)"Binding",(char (*) [8])&local_3e8,in_R9)
              ;
              if (psVar41->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)psVar41);
              }
              pSVar39 = local_370;
              pSVar19 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   *(uint *)&(local_370->super_IVariant).field_0xc);
              get_type_address_space_abi_cxx11_
                        (&local_360,pCVar32,pSVar19,(pSVar39->super_IVariant).self.id,true);
              plVar21 = (long *)::std::__cxx11::string::append((char *)&local_360);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              psVar27 = (size_type *)(plVar21 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar21 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8.field_2._8_8_ = plVar21[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8._M_dataplus._M_p = (pointer)*plVar21;
              }
              local_3e8._M_string_length = plVar21[1];
              *plVar21 = (long)psVar27;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              plVar21 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3e8,local_3b8._0_8_);
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              psVar27 = (size_type *)(plVar21 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar21 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408.field_2._8_8_ = plVar21[3];
              }
              else {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408._M_dataplus._M_p = (pointer)*plVar21;
              }
              local_408._M_string_length = plVar21[1];
              *plVar21 = (long)psVar27;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)psVar41,(ulong)local_408._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p);
              }
              uVar42 = pRVar34->index;
              cVar13 = '\x01';
              if (9 < uVar42) {
                uVar31 = uVar42;
                cVar11 = '\x04';
                do {
                  cVar13 = cVar11;
                  if (uVar31 < 100) {
                    cVar13 = cVar13 + -2;
                    goto LAB_002e44ae;
                  }
                  if (uVar31 < 1000) {
                    cVar13 = cVar13 + -1;
                    goto LAB_002e44ae;
                  }
                  if (uVar31 < 10000) goto LAB_002e44ae;
                  bVar12 = 99999 < uVar31;
                  uVar31 = uVar31 / 10000;
                  cVar11 = cVar13 + '\x04';
                } while (bVar12);
                cVar13 = cVar13 + '\x01';
              }
LAB_002e44ae:
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_360,cVar13);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_360._M_dataplus._M_p,(uint)local_360._M_string_length,uVar42);
              puVar23 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,0x37b28a);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              psVar27 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8.field_2._8_8_ = puVar23[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *psVar27;
                local_3e8._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_3e8._M_string_length = puVar23[1];
              *puVar23 = psVar27;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              psVar27 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408.field_2._8_8_ = puVar23[3];
              }
              else {
                local_408.field_2._M_allocated_capacity = *psVar27;
                local_408._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_408._M_string_length = puVar23[1];
              *puVar23 = psVar27;
              puVar23[1] = 0;
              *(undefined1 *)(puVar23 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)psVar41,(ulong)local_408._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p);
              }
              sVar16 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_368,&local_3c4.id);
              if (sVar16 != 0) {
                ::std::__cxx11::string::append((char *)psVar41);
              }
              ::std::__cxx11::string::append((char *)psVar41);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
            }
            uVar42 = (pRVar34->var->super_IVariant).self.id;
            SmallVector<unsigned_int,_8UL>::reserve
                      (local_2d0,
                       (local_378->buffer_aliases_discrete).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar3 = (local_378->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
            (local_378->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr[sVar3] = uVar42;
            (local_378->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size =
                 sVar3 + 1;
            pCVar32 = local_378;
          }
        }
        break;
      case Image:
        if (local_3c0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        pSVar22 = Variant::get<spirv_cross::SPIRType>
                            ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(local_370->super_IVariant).field_0xc);
        if (((*(int *)&(pSVar22->super_IVariant).field_0xc == 0x10) &&
            ((pSVar22->image).dim == DimSubpassData)) &&
           ((pCVar32->msl_options).use_framebuffer_fetch_subpasses != false)) {
          if (((pCVar32->msl_options).platform == macOS) &&
             ((pCVar32->msl_options).msl_version < 0x4f4c)) {
            prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_3b8._0_8_ = local_3a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3b8,
                       "Framebuffer fetch on Mac is not supported before MSL 2.3.","");
            ::std::runtime_error::runtime_error(prVar24,(string *)local_3b8);
            *(undefined ***)prVar24 = &PTR__runtime_error_003fce08;
            __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,pCVar32,pSVar19,(ulong)local_3c4.id);
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = plVar21[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_408._M_string_length = plVar21[1];
          *plVar21 = (long)psVar27;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          uVar42 = pRVar34->index;
          cVar13 = '\x01';
          if (9 < uVar42) {
            uVar31 = uVar42;
            cVar11 = '\x04';
            do {
              cVar13 = cVar11;
              if (uVar31 < 100) {
                cVar13 = cVar13 + -2;
                goto LAB_002e40e2;
              }
              if (uVar31 < 1000) {
                cVar13 = cVar13 + -1;
                goto LAB_002e40e2;
              }
              if (uVar31 < 10000) goto LAB_002e40e2;
              bVar12 = 99999 < uVar31;
              uVar31 = uVar31 / 10000;
              cVar11 = cVar13 + '\x04';
            } while (bVar12);
            cVar13 = cVar13 + '\x01';
          }
LAB_002e40e2:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
          puVar23 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b153);
          pCVar32 = local_378;
          psVar41 = local_3c0;
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = puVar23[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_408._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
        }
        else {
          (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,pCVar32,pSVar19,(ulong)local_3c4.id);
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = plVar21[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_408._M_string_length = plVar21[1];
          *plVar21 = (long)psVar27;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if (pRVar34->plane != 0) {
            join<std::__cxx11::string&,unsigned_int&>
                      ((string *)local_3b8,(spirv_cross *)local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pRVar34->plane,(uint *)pSVar39);
            ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
            if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
              operator_delete((void *)local_3b8._0_8_);
            }
          }
          uVar42 = pRVar34->index;
          cVar13 = '\x01';
          if (9 < uVar42) {
            uVar31 = uVar42;
            cVar11 = '\x04';
            do {
              cVar13 = cVar11;
              if (uVar31 < 100) {
                cVar13 = cVar13 + -2;
                goto LAB_002e3903;
              }
              if (uVar31 < 1000) {
                cVar13 = cVar13 + -1;
                goto LAB_002e3903;
              }
              if (uVar31 < 10000) goto LAB_002e3903;
              bVar12 = 99999 < uVar31;
              uVar31 = uVar31 / 10000;
              cVar11 = cVar13 + '\x04';
            } while (bVar12);
            cVar13 = cVar13 + '\x01';
          }
LAB_002e3903:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
          puVar23 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b361);
          pCVar32 = local_378;
          psVar41 = local_3c0;
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = puVar23[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_408._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar16 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_368,&local_3c4.id);
          if (sVar16 != 0) {
            ::std::__cxx11::string::append((char *)local_3c0);
          }
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        local_3b8._0_4_ = (local_370->super_IVariant).self.id;
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(local_2c0,(key_type *)local_3b8);
        if (sVar16 != 0) {
          pSVar19 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (pSVar22->image).type.id
                              );
          (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_408,pCVar32,pSVar19,0);
          plVar21 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_408,0,(char *)0x0,0x37b3a7);
          psVar41 = local_3c0;
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3c0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          ::std::operator+(&local_408,"* ",&pRVar34->name);
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_408);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          uVar42 = pRVar34->secondary_index;
          cVar13 = '\x01';
          if (9 < uVar42) {
            uVar31 = uVar42;
            cVar11 = '\x04';
            do {
              cVar13 = cVar11;
              if (uVar31 < 100) {
                cVar13 = cVar13 + -2;
                goto LAB_002e3d8c;
              }
              if (uVar31 < 1000) {
                cVar13 = cVar13 + -1;
                goto LAB_002e3d8c;
              }
              if (uVar31 < 10000) goto LAB_002e3d8c;
              bVar12 = 99999 < uVar31;
              uVar31 = uVar31 / 10000;
              cVar11 = cVar13 + '\x04';
            } while (bVar12);
            cVar13 = cVar13 + '\x01';
          }
LAB_002e3d8c:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
          puVar23 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b28a);
          pCVar32 = local_378;
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = puVar23[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_408._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(puVar23 + 2);
          if ((SPIRVariable *)*puVar23 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = puVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*puVar23;
          }
          local_3b8._8_8_ = puVar23[1];
          *puVar23 = pSVar39;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar16 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_368,&local_3c4.id);
          if (sVar16 != 0) {
            ::std::__cxx11::string::append((char *)local_3c0);
          }
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        break;
      default:
        if (local_3c0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        if (pSVar19->pointer == false) {
          pSVar22 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar32->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(local_370->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_(&local_320,pCVar32,pSVar22,local_3c4.id,false);
          puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_320);
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          puVar28 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar28) {
            local_360.field_2._M_allocated_capacity = *puVar28;
            local_360.field_2._8_8_ = puVar23[3];
          }
          else {
            local_360.field_2._M_allocated_capacity = *puVar28;
            local_360._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_360._M_string_length = puVar23[1];
          *puVar23 = puVar28;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_340,pCVar32,pSVar19,(ulong)local_3c4.id);
          psVar41 = local_3c0;
          uVar35 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            uVar35 = local_360.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar35 < local_340._M_string_length + local_360._M_string_length) {
            uVar35 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              uVar35 = local_340.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar35 < local_340._M_string_length + local_360._M_string_length)
            goto LAB_002e3241;
            puVar23 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_340,0,(char *)0x0,(ulong)local_360._M_dataplus._M_p);
          }
          else {
LAB_002e3241:
            puVar23 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_360,(ulong)local_340._M_dataplus._M_p);
          }
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_3e8.field_2._M_allocated_capacity = *psVar27;
            local_3e8.field_2._8_8_ = puVar23[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = *psVar27;
            local_3e8._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_3e8._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)psVar27 = 0;
          puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = puVar23[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_408._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          psVar8 = &local_320;
          _Var37._M_p = local_320._M_dataplus._M_p;
        }
        else {
          (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_3e8,pCVar32,pSVar19,(ulong)local_3c4.id);
          plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          psVar41 = local_3c0;
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          psVar27 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408.field_2._8_8_ = plVar21[3];
          }
          else {
            local_408.field_2._M_allocated_capacity = *psVar27;
            local_408._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_408._M_string_length = plVar21[1];
          *plVar21 = (long)psVar27;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          plVar21 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar39 = (SPIRVariable *)(plVar21 + 2);
          if ((SPIRVariable *)*plVar21 == pSVar39) {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar21[3];
          }
          else {
            local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar21;
          }
          local_3b8._8_8_ = plVar21[1];
          *plVar21 = (long)pSVar39;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p);
          }
          psVar8 = &local_3e8;
          _Var37._M_p = local_3e8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var37._M_p != &psVar8->field_2) {
          operator_delete(_Var37._M_p);
        }
        uVar42 = pRVar34->index;
        cVar13 = '\x01';
        if (9 < uVar42) {
          uVar31 = uVar42;
          cVar11 = '\x04';
          do {
            cVar13 = cVar11;
            if (uVar31 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_002e36ed;
            }
            if (uVar31 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_002e36ed;
            }
            if (uVar31 < 10000) goto LAB_002e36ed;
            bVar12 = 99999 < uVar31;
            uVar31 = uVar31 / 10000;
            cVar11 = cVar13 + '\x04';
          } while (bVar12);
          cVar13 = cVar13 + '\x01';
        }
LAB_002e36ed:
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
        puVar23 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b28a);
        pCVar32 = local_378;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        psVar27 = puVar23 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408.field_2._8_8_ = puVar23[3];
        }
        else {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408._M_dataplus._M_p = (pointer)*puVar23;
        }
        local_408._M_string_length = puVar23[1];
        *puVar23 = psVar27;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
        local_3b8._0_8_ = local_3a8;
        pSVar39 = (SPIRVariable *)(puVar23 + 2);
        if ((SPIRVariable *)*puVar23 == pSVar39) {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = puVar23[3];
        }
        else {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*puVar23;
        }
        local_3b8._8_8_ = puVar23[1];
        *puVar23 = pSVar39;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_368,&local_3c4.id);
        if (sVar16 != 0) {
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        ::std::__cxx11::string::append((char *)local_3c0);
        break;
      case Sampler:
        if (local_3c0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3c0);
        }
        sampler_type_abi_cxx11_(&local_3e8,pCVar32,pSVar19,local_3c4.id);
        plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
        psVar41 = local_3c0;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        psVar27 = (size_type *)(plVar21 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408.field_2._8_8_ = plVar21[3];
        }
        else {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408._M_dataplus._M_p = (pointer)*plVar21;
        }
        local_408._M_string_length = plVar21[1];
        *plVar21 = (long)psVar27;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        plVar21 = (long *)::std::__cxx11::string::_M_append
                                    ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
        local_3b8._0_8_ = local_3a8;
        pSVar39 = (SPIRVariable *)(plVar21 + 2);
        if ((SPIRVariable *)*plVar21 == pSVar39) {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = plVar21[3];
        }
        else {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*plVar21;
        }
        local_3b8._8_8_ = plVar21[1];
        *plVar21 = (long)pSVar39;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        uVar42 = pRVar34->index;
        cVar13 = '\x01';
        if (9 < uVar42) {
          uVar31 = uVar42;
          cVar11 = '\x04';
          do {
            cVar13 = cVar11;
            if (uVar31 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_002e32d0;
            }
            if (uVar31 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_002e32d0;
            }
            if (uVar31 < 10000) goto LAB_002e32d0;
            bVar12 = 99999 < uVar31;
            uVar31 = uVar31 / 10000;
            cVar11 = cVar13 + '\x04';
          } while (bVar12);
          cVar13 = cVar13 + '\x01';
        }
LAB_002e32d0:
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
        puVar23 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b355);
        pCVar32 = local_378;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        psVar27 = puVar23 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408.field_2._8_8_ = puVar23[3];
        }
        else {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408._M_dataplus._M_p = (pointer)*puVar23;
        }
        local_408._M_string_length = puVar23[1];
        *puVar23 = psVar27;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
        local_3b8._0_8_ = local_3a8;
        pSVar39 = (SPIRVariable *)(puVar23 + 2);
        if ((SPIRVariable *)*puVar23 == pSVar39) {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = puVar23[3];
        }
        else {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*puVar23;
        }
        local_3b8._8_8_ = puVar23[1];
        *puVar23 = pSVar39;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
        goto LAB_002e34bb;
      case AccelerationStructure:
        (*(pCVar32->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_360,pCVar32,pSVar19);
        plVar21 = (long *)::std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,0x37aab7);
        psVar41 = local_3c0;
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        psVar27 = (size_type *)(plVar21 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_3e8.field_2._M_allocated_capacity = *psVar27;
          local_3e8.field_2._8_8_ = plVar21[3];
        }
        else {
          local_3e8.field_2._M_allocated_capacity = *psVar27;
          local_3e8._M_dataplus._M_p = (pointer)*plVar21;
        }
        local_3e8._M_string_length = plVar21[1];
        *plVar21 = (long)psVar27;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        plVar21 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        psVar27 = (size_type *)(plVar21 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408.field_2._8_8_ = plVar21[3];
        }
        else {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408._M_dataplus._M_p = (pointer)*plVar21;
        }
        local_408._M_string_length = plVar21[1];
        *plVar21 = (long)psVar27;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        plVar21 = (long *)::std::__cxx11::string::_M_append
                                    ((char *)&local_408,(ulong)(pRVar34->name)._M_dataplus._M_p);
        local_3b8._0_8_ = local_3a8;
        pSVar39 = (SPIRVariable *)(plVar21 + 2);
        if ((SPIRVariable *)*plVar21 == pSVar39) {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = plVar21[3];
        }
        else {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*plVar21;
        }
        local_3b8._8_8_ = plVar21[1];
        *plVar21 = (long)pSVar39;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        uVar42 = pRVar34->index;
        cVar13 = '\x01';
        if (9 < uVar42) {
          uVar31 = uVar42;
          cVar11 = '\x04';
          do {
            cVar13 = cVar11;
            if (uVar31 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_002e33c9;
            }
            if (uVar31 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_002e33c9;
            }
            if (uVar31 < 10000) goto LAB_002e33c9;
            bVar12 = 99999 < uVar31;
            uVar31 = uVar31 / 10000;
            cVar11 = cVar13 + '\x04';
          } while (bVar12);
          cVar13 = cVar13 + '\x01';
        }
LAB_002e33c9:
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar13);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar42);
        puVar23 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x37b28a);
        pCVar32 = local_378;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        psVar27 = puVar23 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408.field_2._8_8_ = puVar23[3];
        }
        else {
          local_408.field_2._M_allocated_capacity = *psVar27;
          local_408._M_dataplus._M_p = (pointer)*puVar23;
        }
        local_408._M_string_length = puVar23[1];
        *puVar23 = psVar27;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        puVar23 = (undefined8 *)::std::__cxx11::string::append((char *)&local_408);
        local_3b8._0_8_ = local_3a8;
        pSVar39 = (SPIRVariable *)(puVar23 + 2);
        if ((SPIRVariable *)*puVar23 == pSVar39) {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = puVar23[3];
        }
        else {
          local_3a8._0_8_ = (pSVar39->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*puVar23;
        }
        local_3b8._8_8_ = puVar23[1];
        *puVar23 = pSVar39;
        puVar23[1] = 0;
        *(undefined1 *)(puVar23 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)psVar41,local_3b8._0_8_);
LAB_002e34bb:
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
      }
      pRVar34 = pRVar34 + 1;
    } while (pRVar34 != local_2b8);
  }
  SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_248);
  return;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
				if (descriptor_set_is_argument_buffer(desc_set))
					return;
			}

			// Handle descriptor aliasing. We can handle aliasing of buffers by casting pointers,
			// but not for typed resources.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						// Possible, but horrible to implement, ignore for now.
						if (!type.array.empty())
							SPIRV_CROSS_THROW("Aliasing arrayed discrete descriptors is currently not supported.");

						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({ &var, descriptor_alias, to_name(var_id), SPIRType::Image,
					                      get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({ &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                      get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources.push_back({ &var, descriptor_alias, to_name(var_id), type.basetype,
				                      resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(), [](const Resource &lhs, const Resource &rhs) {
		return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index);
	});

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.descriptor_alias)
			{
				if (r.var == r.descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				// Metal doesn't directly support this, so we must expand the
				// array. We'll declare a local array to hold these elements
				// later.
				uint32_t array_size = to_array_size_literal(type);

				if (array_size == 0)
					SPIRV_CROSS_THROW("Unsized arrays of buffers are not supported in MSL.");

				// Allow Metal to use the array<T> template to make arrays a value type
				is_using_builtin_array = true;
				buffer_arrays_discrete.push_back(var_id);
				for (uint32_t i = 0; i < array_size; ++i)
				{
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " + to_restrict(var_id, true) +
					           r.name + "_" + convert_to_string(i);
					ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    get_argument_address_space(var) + " " + type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id) + " " + r.name;
			ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);
				ep_args += " [[texture(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars.count(var.self))
			{
				ep_args += ", device atomic_" + type_to_glsl(get<SPIRType>(basetype.image.type), 0);
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
			ep_args += ", " + type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			break;
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}